

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

WitnessSize __thiscall miniscript::Node<unsigned_int>::CalcWitnessSize(Node<unsigned_int> *this)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  MaxInt<unsigned_int> MVar6;
  MaxInt<unsigned_int> *pMVar7;
  MaxInt<unsigned_int> *pMVar8;
  size_t j;
  uint uVar9;
  pointer psVar10;
  ulong uVar11;
  long lVar12;
  MaxInt<unsigned_int> MVar13;
  long in_FS_OFFSET;
  WitnessSize WVar14;
  MaxInt<unsigned_int> local_80;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  next_sats;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  sats;
  MaxInt<unsigned_int> local_48;
  MaxInt<unsigned_int> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = IsTapscript(this->m_script_ctx);
  uVar5 = 0x49;
  if (bVar3) {
    uVar5 = 0x42;
  }
  bVar3 = IsTapscript(this->m_script_ctx);
  MVar6.value = 0;
  MVar6._0_4_ = this->fragment;
  MVar13.valid = true;
  MVar13._1_3_ = 0;
  MVar13.value = 0;
  switch(MVar6) {
  case (MaxInt<unsigned_int>)0x0:
    break;
  case (MaxInt<unsigned_int>)0x1:
  case (MaxInt<unsigned_int>)0x4:
  case (MaxInt<unsigned_int>)0x5:
    MVar6.valid = true;
    MVar6._1_3_ = 0;
    MVar6.value = 0;
    goto LAB_0017757a;
  case (MaxInt<unsigned_int>)0x2:
    MVar13.valid = true;
    MVar13._1_3_ = 0;
    MVar13.value = 1;
    goto LAB_00177567;
  case (MaxInt<unsigned_int>)0x3:
    uVar5 = (uVar5 - bVar3) + 0x22;
    uVar9 = bVar3 ^ 0x23;
    goto LAB_001773cd;
  case (MaxInt<unsigned_int>)0x6:
  case (MaxInt<unsigned_int>)0x7:
  case (MaxInt<unsigned_int>)0x8:
  case (MaxInt<unsigned_int>)0x9:
    MVar6.valid = true;
    MVar6._1_3_ = 0;
    MVar6.value = 0x21;
    goto LAB_0017757a;
  case (MaxInt<unsigned_int>)0xa:
  case (MaxInt<unsigned_int>)0xb:
  case (MaxInt<unsigned_int>)0xc:
  case (MaxInt<unsigned_int>)0x10:
    peVar2 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    MVar6 = (peVar2->ws).sat;
    MVar13 = *(MaxInt<unsigned_int> *)((long)&peVar2->ws + 8);
    break;
  case (MaxInt<unsigned_int>)0xd:
    peVar2 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    bVar3 = (peVar2->ws).sat.valid != '\x01';
    if (bVar3) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)(*(uint *)((long)&peVar2->ws + 4) + 2) << 0x20;
    }
    MVar6 = (MaxInt<unsigned_int>)(uVar11 | !bVar3);
    MVar13.valid = true;
    MVar13._1_3_ = 0;
    MVar13.value = 1;
    break;
  case (MaxInt<unsigned_int>)0xe:
    MVar6 = (((((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->ws).sat;
    goto LAB_0017757a;
  case (MaxInt<unsigned_int>)0xf:
    MVar13.valid = true;
    MVar13._1_3_ = 0;
    MVar13.value = 1;
    MVar6 = (((((this->subs).
                super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->ws).sat;
    break;
  case (MaxInt<unsigned_int>)0x11:
    psVar10 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    MVar6 = internal::operator+(&(((psVar10->
                                   super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->ws).sat,
                                &((psVar10[1].
                                   super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->ws).sat);
    goto LAB_0017757a;
  case (MaxInt<unsigned_int>)0x12:
    psVar10 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    MVar6 = internal::operator+(&(((psVar10->
                                   super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->ws).sat,
                                &((psVar10[1].
                                   super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->ws).sat);
    psVar10 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar7 = (MaxInt<unsigned_int> *)
             ((long)&((psVar10->
                      super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->ws + 8);
    pMVar8 = (MaxInt<unsigned_int> *)
             ((long)&(psVar10[1].
                      super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->ws + 8);
    goto LAB_00177533;
  case (MaxInt<unsigned_int>)0x13:
    psVar10 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)internal::operator+((MaxInt<unsigned_int> *)
                                      ((long)&((psVar10->
                                               super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr)->ws + 8),
                                      &((psVar10[1].
                                         super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->ws).sat);
    pMVar8 = (MaxInt<unsigned_int> *)&sats;
    psVar10 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    next_sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)internal::operator+(&(((psVar10->
                                         super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr)->ws).sat,
                                      (MaxInt<unsigned_int> *)
                                      ((long)&(psVar10[1].
                                               super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr)->ws + 8));
    pMVar7 = (MaxInt<unsigned_int> *)&next_sats;
    goto LAB_00177494;
  case (MaxInt<unsigned_int>)0x14:
    psVar10 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = (psVar10->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)internal::operator+((MaxInt<unsigned_int> *)((long)&peVar2->ws + 8),
                                      &((psVar10[1].
                                         super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->ws).sat);
    MVar6 = internal::operator|(&(peVar2->ws).sat,(MaxInt<unsigned_int> *)&sats);
LAB_0017757a:
    MVar13.valid = false;
    MVar13._1_3_ = 0;
    MVar13.value = 0;
    break;
  case (MaxInt<unsigned_int>)0x15:
    psVar10 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = (psVar10->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    pMVar8 = &(peVar2->ws).sat;
    sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)internal::operator+((MaxInt<unsigned_int> *)((long)&peVar2->ws + 8),
                                      &((psVar10[1].
                                         super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->ws).sat);
    pMVar7 = (MaxInt<unsigned_int> *)&sats;
LAB_00177494:
    MVar6 = internal::operator|(pMVar8,pMVar7);
    psVar10 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar7 = (MaxInt<unsigned_int> *)
             ((long)&((psVar10->
                      super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->ws + 8);
    pMVar8 = (MaxInt<unsigned_int> *)
             ((long)&(psVar10[1].
                      super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->ws + 8);
    goto LAB_00177533;
  case (MaxInt<unsigned_int>)0x16:
    psVar10 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = (psVar10->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar11 = (ulong)(peVar2->ws).sat.valid;
    if (uVar11 == 1) {
      uVar4 = (ulong)(*(uint *)((long)&peVar2->ws + 4) + 2) << 0x20;
    }
    else {
      uVar4 = 0;
    }
    sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(uVar4 | uVar11);
    peVar2 = psVar10[1].
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    bVar3 = (peVar2->ws).sat.valid != '\x01';
    if (bVar3) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)(*(uint *)((long)&peVar2->ws + 4) + 1) << 0x20;
    }
    next_sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(uVar11 | !bVar3);
    MVar6 = internal::operator|((MaxInt<unsigned_int> *)&sats,(MaxInt<unsigned_int> *)&next_sats);
    psVar10 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = (psVar10->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar11 = (ulong)((MaxInt<unsigned_int> *)((long)&peVar2->ws + 8))->valid;
    if (uVar11 == 1) {
      uVar4 = (ulong)(*(uint *)((long)&peVar2->ws + 0xc) + 2) << 0x20;
    }
    else {
      uVar4 = 0;
    }
    local_40 = (MaxInt<unsigned_int>)(uVar4 | uVar11);
    peVar2 = psVar10[1].
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    bVar3 = ((MaxInt<unsigned_int> *)((long)&peVar2->ws + 8))->valid != true;
    if (bVar3) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)(*(uint *)((long)&peVar2->ws + 0xc) + 1) << 0x20;
    }
    local_48 = (MaxInt<unsigned_int>)(uVar11 | !bVar3);
    MVar13 = internal::operator|(&local_40,&local_48);
    break;
  case (MaxInt<unsigned_int>)0x17:
    psVar10 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)internal::operator+(&(((psVar10->
                                         super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr)->ws).sat,
                                      &((psVar10[1].
                                         super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->ws).sat);
    psVar10 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    next_sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)internal::operator+((MaxInt<unsigned_int> *)
                                      ((long)&((psVar10->
                                               super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr)->ws + 8),
                                      &((psVar10[2].
                                         super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->ws).sat);
    MVar6 = internal::operator|((MaxInt<unsigned_int> *)&sats,(MaxInt<unsigned_int> *)&next_sats);
    psVar10 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar7 = (MaxInt<unsigned_int> *)
             ((long)&((psVar10->
                      super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->ws + 8);
    pMVar8 = (MaxInt<unsigned_int> *)
             ((long)&(psVar10[2].
                      super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->ws + 8);
LAB_00177533:
    MVar13 = internal::operator+(pMVar7,pMVar8);
    break;
  case (MaxInt<unsigned_int>)0x18:
    next_sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(next_sats.
                           super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
    next_sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)next_sats.
                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff);
    Vector<miniscript::internal::MaxInt<unsigned_int>>(&sats,(MaxInt<unsigned_int> *)&next_sats);
    psVar1 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar10 = (this->subs).
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar1;
        psVar10 = psVar10 + 1) {
      local_40 = internal::operator+(sats.
                                     super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     &(((psVar10->
                                        super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->ws).dsat);
      Vector<miniscript::internal::MaxInt<unsigned_int>>(&next_sats,&local_40);
      lVar12 = 0;
      for (uVar11 = 1;
          uVar11 < (ulong)((long)sats.
                                 super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)sats.
                                 super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar11 = uVar11 + 1) {
        local_48 = internal::operator+((MaxInt<unsigned_int> *)
                                       (&sats.
                                         super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[1].valid + lVar12
                                       ),&(((psVar10->
                                            super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr)->ws).dsat);
        local_80 = internal::operator+((MaxInt<unsigned_int> *)
                                       (&(sats.
                                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->valid + lVar12
                                       ),&(((psVar10->
                                            super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr)->ws).sat);
        local_40 = internal::operator|(&local_48,&local_80);
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
        ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                  ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                    *)&next_sats,&local_40);
        lVar12 = lVar12 + 8;
      }
      local_40 = internal::operator+((MaxInt<unsigned_int> *)
                                     ((long)sats.
                                            super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                     ((long)sats.
                                            super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)sats.
                                           super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + -8),
                                     &(((psVar10->
                                        super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->ws).sat);
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
      ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                  *)&next_sats,&local_40);
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::_M_move_assign(&sats,(MaxInt<unsigned_int> *)&next_sats);
      std::
      _Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::~_Vector_base((_Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                       *)&next_sats);
    }
    if ((ulong)((long)sats.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)sats.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) < (ulong)this->k) {
      __assert_fail("k <= sats.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                    ,0x483,
                    "internal::WitnessSize miniscript::Node<unsigned int>::CalcWitnessSize() const [Key = unsigned int]"
                   );
    }
    MVar6 = sats.
            super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[this->k];
    MVar13 = *sats.
              super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    std::
    _Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ::~_Vector_base(&sats.
                     super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                   );
    break;
  case (MaxInt<unsigned_int>)0x19:
    uVar5 = uVar5 * this->k + 1;
    uVar9 = this->k + 1;
LAB_001773cd:
    lVar12 = (ulong)uVar9 << 0x20;
LAB_00177564:
    MVar13 = (MaxInt<unsigned_int>)(lVar12 + 1);
LAB_00177567:
    MVar6 = (MaxInt<unsigned_int>)(((ulong)uVar5 << 0x20) + 1);
    break;
  case (MaxInt<unsigned_int>)0x1a:
    uVar11 = (long)(this->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (uVar5 - 1) * this->k + (int)(uVar11 >> 2);
    lVar12 = (uVar11 & 0xfffffffffffffffc) << 0x1e;
    goto LAB_00177564;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                  ,0x487,
                  "internal::WitnessSize miniscript::Node<unsigned int>::CalcWitnessSize() const [Key = unsigned int]"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  WVar14.dsat = MVar13;
  WVar14.sat = MVar6;
  return WVar14;
}

Assistant:

internal::WitnessSize CalcWitnessSize() const {
        const uint32_t sig_size = IsTapscript(m_script_ctx) ? 1 + 65 : 1 + 72;
        const uint32_t pubkey_size = IsTapscript(m_script_ctx) ? 1 + 32 : 1 + 33;
        switch (fragment) {
            case Fragment::JUST_0: return {{}, 0};
            case Fragment::JUST_1:
            case Fragment::OLDER:
            case Fragment::AFTER: return {0, {}};
            case Fragment::PK_K: return {sig_size, 1};
            case Fragment::PK_H: return {sig_size + pubkey_size, 1 + pubkey_size};
            case Fragment::SHA256:
            case Fragment::RIPEMD160:
            case Fragment::HASH256:
            case Fragment::HASH160: return {1 + 32, {}};
            case Fragment::ANDOR: {
                const auto sat{(subs[0]->ws.sat + subs[1]->ws.sat) | (subs[0]->ws.dsat + subs[2]->ws.sat)};
                const auto dsat{subs[0]->ws.dsat + subs[2]->ws.dsat};
                return {sat, dsat};
            }
            case Fragment::AND_V: return {subs[0]->ws.sat + subs[1]->ws.sat, {}};
            case Fragment::AND_B: return {subs[0]->ws.sat + subs[1]->ws.sat, subs[0]->ws.dsat + subs[1]->ws.dsat};
            case Fragment::OR_B: {
                const auto sat{(subs[0]->ws.dsat + subs[1]->ws.sat) | (subs[0]->ws.sat + subs[1]->ws.dsat)};
                const auto dsat{subs[0]->ws.dsat + subs[1]->ws.dsat};
                return {sat, dsat};
            }
            case Fragment::OR_C: return {subs[0]->ws.sat | (subs[0]->ws.dsat + subs[1]->ws.sat), {}};
            case Fragment::OR_D: return {subs[0]->ws.sat | (subs[0]->ws.dsat + subs[1]->ws.sat), subs[0]->ws.dsat + subs[1]->ws.dsat};
            case Fragment::OR_I: return {(subs[0]->ws.sat + 1 + 1) | (subs[1]->ws.sat + 1), (subs[0]->ws.dsat + 1 + 1) | (subs[1]->ws.dsat + 1)};
            case Fragment::MULTI: return {k * sig_size + 1, k + 1};
            case Fragment::MULTI_A: return {k * sig_size + static_cast<uint32_t>(keys.size()) - k, static_cast<uint32_t>(keys.size())};
            case Fragment::WRAP_A:
            case Fragment::WRAP_N:
            case Fragment::WRAP_S:
            case Fragment::WRAP_C: return subs[0]->ws;
            case Fragment::WRAP_D: return {1 + 1 + subs[0]->ws.sat, 1};
            case Fragment::WRAP_V: return {subs[0]->ws.sat, {}};
            case Fragment::WRAP_J: return {subs[0]->ws.sat, 1};
            case Fragment::THRESH: {
                auto sats = Vector(internal::MaxInt<uint32_t>(0));
                for (const auto& sub : subs) {
                    auto next_sats = Vector(sats[0] + sub->ws.dsat);
                    for (size_t j = 1; j < sats.size(); ++j) next_sats.push_back((sats[j] + sub->ws.dsat) | (sats[j - 1] + sub->ws.sat));
                    next_sats.push_back(sats[sats.size() - 1] + sub->ws.sat);
                    sats = std::move(next_sats);
                }
                assert(k <= sats.size());
                return {sats[k], sats[0]};
            }
        }
        assert(false);
    }